

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O2

bool EndsWith(string *fullString,string *ending,bool caseInsensitive)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> substr;
  string comparison;
  string sStack_58;
  string local_38;
  
  if (fullString->_M_string_length < ending->_M_string_length) {
    _Var1 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)&sStack_58,(ulong)fullString);
    std::__cxx11::string::string((string *)&local_38,(string *)ending);
    if (caseInsensitive) {
      ToLowerInplace(&sStack_58);
      ToLowerInplace(&local_38);
    }
    _Var1 = std::operator==(&sStack_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&sStack_58);
  }
  return _Var1;
}

Assistant:

bool EndsWith(const std::string& fullString, const std::string& ending, bool caseInsensitive)
{
    if (fullString.length() >= ending.length())
    {
        auto substr = fullString.substr(fullString.length() - ending.length(), ending.length());
        auto comparison = ending;

        if (caseInsensitive)
        {
            ToLowerInplace(substr);
            ToLowerInplace(comparison);
        }

        return substr == comparison;
    } else {
        return false;
    }
}